

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

uint8_t __thiscall icu_63::ReorderingBuffer::previousCC(ReorderingBuffer *this)

{
  UChar UVar1;
  UChar UVar2;
  UChar *pUVar3;
  uint16_t uVar4;
  uint8_t uVar5;
  uint c;
  
  pUVar3 = this->codePointStart;
  this->codePointLimit = pUVar3;
  if (this->reorderStart < pUVar3) {
    this->codePointStart = pUVar3 + -1;
    UVar1 = pUVar3[-1];
    c = (uint)(ushort)UVar1;
    if ((((c & 0xfc00) == 0xdc00) && (this->start < pUVar3 + -1)) &&
       (UVar2 = pUVar3[-2], (UVar2 & 0xfc00U) == 0xd800)) {
      this->codePointStart = pUVar3 + -2;
      c = (uint)(ushort)UVar1 + (uint)(ushort)UVar2 * 0x400 + 0xfca02400;
    }
    uVar5 = '\0';
    if ((ushort)this->impl->minCompNoMaybeCP <= c) {
      uVar4 = Normalizer2Impl::getNorm16(this->impl,c);
      uVar5 = '\0';
      if (0xfbff < uVar4) {
        uVar5 = (uint8_t)(uVar4 >> 1);
      }
    }
  }
  else {
    uVar5 = '\0';
  }
  return uVar5;
}

Assistant:

uint8_t ReorderingBuffer::previousCC() {
    codePointLimit=codePointStart;
    if(reorderStart>=codePointStart) {
        return 0;
    }
    UChar32 c=*--codePointStart;
    UChar c2;
    if(U16_IS_TRAIL(c) && start<codePointStart && U16_IS_LEAD(c2=*(codePointStart-1))) {
        --codePointStart;
        c=U16_GET_SUPPLEMENTARY(c2, c);
    }
    return impl.getCCFromYesOrMaybeCP(c);
}